

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp sexp_type_slot_offset_op(sexp ctx,sexp self,sexp_sint_t n,sexp type,sexp slot)

{
  sexp psVar1;
  sexp psVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  
  if ((((ulong)type & 3) == 0) && (type->tag == 1)) {
    psVar1 = (type->value).type.cpl;
    if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 10)) {
      uVar3 = *(int *)&psVar1->value - 1;
    }
    else {
      psVar1 = (sexp)&type->value;
      uVar3 = 0;
    }
    do {
      if ((int)uVar3 < 0) {
        return (sexp)&DAT_0000003e;
      }
      uVar6 = (ulong)uVar3;
      iVar5 = 0;
      for (piVar4 = (int *)(*(long *)((long)&psVar1->value + uVar6 * 8 + 8) + 0x18);
          (piVar4 = *(int **)piVar4, ((ulong)piVar4 & 3) == 0 && (*piVar4 == 6));
          piVar4 = piVar4 + 4) {
        if (*(sexp *)(piVar4 + 2) == slot) {
          for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
            psVar2 = sexp_length_op(ctx,(sexp)0x0,1,
                                    *(sexp *)(*(long *)((long)&psVar1->value + uVar6 * 8) + 0x18));
            iVar5 = iVar5 + (int)((ulong)psVar2 >> 1);
          }
          return (sexp)((long)iVar5 * 2 + 1);
        }
        iVar5 = iVar5 + 1;
      }
      uVar3 = uVar3 - 1;
    } while( true );
  }
  psVar1 = sexp_type_exception(ctx,self,1,type);
  return psVar1;
}

Assistant:

sexp sexp_type_slot_offset_op (sexp ctx , sexp self, sexp_sint_t n, sexp type, sexp slot) {
  sexp cpl, slots, *v;
  int i, offset, len;
  sexp_assert_type(ctx, sexp_typep, SEXP_TYPE, type);
  cpl = sexp_type_cpl(type);
  if (sexp_vectorp(cpl)) {
    v = sexp_vector_data(cpl);
    len = sexp_vector_length(cpl);
  } else {
    v = &sexp_type_slots(type);
    len = 1;
  }
  len = sexp_vectorp(cpl) ? sexp_vector_length(cpl) : 1;
  for (i=len-1; i>=0; --i)
    for (slots=sexp_type_slots(v[i]), offset=0; sexp_pairp(slots); slots=sexp_cdr(slots), ++offset)
      if (sexp_car(slots) == slot) {
        while (--i>=0)
          offset += sexp_unbox_fixnum(sexp_length(ctx, sexp_type_slots(v[i])));
        return sexp_make_fixnum(offset);
      }
  return SEXP_FALSE;
}